

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmMovemEaRg<(moira::Instr)78,(moira::Mode)3,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *pSVar2;
  undefined1 local_38 [8];
  Ea<(moira::Mode)3,_4> src;
  RegRegList dst;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  src.ext2._2_2_ = op;
  unique0x100000f3 = addr;
  uVar1 = dasmIncRead<2>(this,addr);
  RegRegList::RegRegList((RegRegList *)&src.ext2,(u16)uVar1);
  Op<(moira::Mode)3,4>
            ((Ea<(moira::Mode)3,_4> *)local_38,this,src.ext2._2_2_ & 7,stack0xffffffffffffffe0);
  pSVar2 = StrWriter::operator<<(str);
  pSVar2 = StrWriter::operator<<(pSVar2);
  pSVar2 = StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
  pSVar2 = StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)3,_4> *)local_38);
  pSVar2 = StrWriter::operator<<(pSVar2);
  StrWriter::operator<<(pSVar2,src.ext2._0_2_);
  return;
}

Assistant:

void
Moira::dasmMovemEaRg(StrWriter &str, u32 &addr, u16 op) const
{
    auto dst = RegRegList ( (u16)dasmIncRead<Word>(addr)  );
    auto src = Op <M,S>   ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}